

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O0

JSONNode * __thiscall JSONNode::operator=(JSONNode *this,JSONNode *orig)

{
  internalJSONNode *piVar1;
  allocator local_41;
  json_string local_40;
  JSONNode *local_20;
  JSONNode *orig_local;
  JSONNode *this_local;
  
  piVar1 = this->internal;
  local_20 = orig;
  orig_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (this->internal != local_20->internal) {
    decRef(this);
    piVar1 = internalJSONNode::incRef(local_20->internal);
    this->internal = piVar1;
  }
  return this;
}

Assistant:

inline JSONNode & JSONNode::operator = (const JSONNode & orig) json_nothrow {
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   if (internal == orig.internal) return *this;  //don't want it accidentally deleting itself
    #endif
    decRef();  //dereference my current one
    internal = orig.internal -> incRef();  //increase reference of original
    return *this;
}